

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionCostCalculator.cpp
# Opt level: O1

void __thiscall
multi_agent_planning::InteractionCostCalculator::InteractionCostCalculator
          (InteractionCostCalculator *this,Scenario *scenario,
          vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *plans,
          int agent_id,float alpha)

{
  _Rb_tree_header *p_Var1;
  pointer pPVar2;
  key_type *pkVar3;
  pointer pIVar4;
  pointer pPVar5;
  vector<std::tuple<int,multi_agent_planning::PlannedAction,int>,std::allocator<std::tuple<int,multi_agent_planning::PlannedAction,int>>>
  *this_00;
  ulong uVar6;
  key_type *__k;
  pointer pPVar7;
  vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
  interactions;
  vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
  local_88;
  tuple<int,_multi_agent_planning::PlannedAction,_int> local_70;
  
  p_Var1 = &(this->interactionMap)._M_t._M_impl.super__Rb_tree_header;
  (this->interactionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->interactionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->interactionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->interactionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->interactionMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->alpha = alpha;
  pPVar5 = (plans->
           super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((plans->
      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>).
      _M_impl.super__Vector_impl_data._M_finish != pPVar5) {
    uVar6 = 0;
    do {
      if (uVar6 != (uint)agent_id) {
        pPVar2 = pPVar5[uVar6].actions.
                 super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pPVar7 = pPVar5[uVar6].actions.
                      super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                      ._M_impl.super__Vector_impl_data._M_start; pPVar7 != pPVar2;
            pPVar7 = pPVar7 + 1) {
          Scenario::getInteractionsOnAgent(&local_88,scenario,(int)uVar6,pPVar7->edge,agent_id);
          pIVar4 = local_88.
                   super__Vector_base<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_88.
              super__Vector_base<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_88.
              super__Vector_base<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            __k = &(local_88.
                    super__Vector_base<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
                    ._M_impl.super__Vector_impl_data._M_start)->actionB;
            do {
              this_00 = (vector<std::tuple<int,multi_agent_planning::PlannedAction,int>,std::allocator<std::tuple<int,multi_agent_planning::PlannedAction,int>>>
                         *)std::
                           map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>_>_>
                           ::operator[](&this->interactionMap,__k);
              local_70.super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>.
              super__Tuple_impl<1UL,_multi_agent_planning::PlannedAction,_int>.
              super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                   SUB84(__k[1].super_edge_base<boost::directed_tag,_unsigned_long>.m_source,0);
              local_70.super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>.
              super__Tuple_impl<1UL,_multi_agent_planning::PlannedAction,_int>.
              super__Head_base<1UL,_multi_agent_planning::PlannedAction,_false>._M_head_impl.edge.
              super_edge_base<boost::directed_tag,_unsigned_long>.m_source =
                   (pPVar7->edge).super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
              local_70.super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>.
              super__Tuple_impl<1UL,_multi_agent_planning::PlannedAction,_int>.
              super__Head_base<1UL,_multi_agent_planning::PlannedAction,_false>._M_head_impl.edge.
              super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
                   (pPVar7->edge).super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
              local_70.super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>.
              super__Tuple_impl<1UL,_multi_agent_planning::PlannedAction,_int>.
              super__Head_base<1UL,_multi_agent_planning::PlannedAction,_false>._M_head_impl.edge.
              m_eproperty = (pPVar7->edge).m_eproperty;
              local_70.super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>.
              super__Tuple_impl<1UL,_multi_agent_planning::PlannedAction,_int>.
              super__Head_base<1UL,_multi_agent_planning::PlannedAction,_false>._M_head_impl.source
                   = pPVar7->source;
              local_70.super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>.
              super__Tuple_impl<1UL,_multi_agent_planning::PlannedAction,_int>.
              super__Head_base<1UL,_multi_agent_planning::PlannedAction,_false>._M_head_impl.target
                   = pPVar7->target;
              local_70.super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>.
              super__Tuple_impl<1UL,_multi_agent_planning::PlannedAction,_int>.
              super__Head_base<1UL,_multi_agent_planning::PlannedAction,_false>._M_head_impl.
              start_time = pPVar7->start_time;
              local_70.super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>.
              super__Tuple_impl<1UL,_multi_agent_planning::PlannedAction,_int>.
              super__Head_base<1UL,_multi_agent_planning::PlannedAction,_false>._M_head_impl.
              action_cost = pPVar7->action_cost;
              local_70.super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>.
              super__Head_base<0UL,_int,_false>._M_head_impl = (int)uVar6;
              std::
              vector<std::tuple<int,multi_agent_planning::PlannedAction,int>,std::allocator<std::tuple<int,multi_agent_planning::PlannedAction,int>>>
              ::emplace_back<std::tuple<int,multi_agent_planning::PlannedAction,int>>
                        (this_00,&local_70);
              pkVar3 = __k + 1;
              __k = __k + 3;
            } while ((pointer)&(pkVar3->super_edge_base<boost::directed_tag,_unsigned_long>).
                               m_target != pIVar4);
          }
          if (local_88.
              super__Vector_base<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.
                            super__Vector_base<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      uVar6 = uVar6 + 1;
      pPVar5 = (plans->
               super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(plans->
                                   super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5 >> 5))
    ;
  }
  return;
}

Assistant:

InteractionCostCalculator::InteractionCostCalculator(Scenario scenario, 
																										const std::vector<Plan>& plans,
																										int agent_id,
																										float alpha) : alpha(alpha) {
	for (int i = 0; i < plans.size(); ++i) {

		if (i == agent_id) continue;

		for (auto const& a: plans[i].actions) {

			vector<Interaction> interactions = scenario.getInteractionsOnAgent(i, a.edge, agent_id);

			for (auto const& interaction : interactions) {
					// cout << interaction.toString() << endl;
					interactionMap[interaction.actionB].push_back(make_tuple(i, a, interaction.cost));
			}

		}
	}
}